

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

void __thiscall
glcts::BlendTestCaseGroup::BlendTest::getTestColors(BlendTest *this,int index,Vec4 *src,Vec4 *dst)

{
  PixelFormat *pf;
  GLfloat *pGVar1;
  float fVar2;
  GLfloat *pGVar3;
  Vec4 *a;
  int iVar4;
  undefined4 extraout_var;
  float fVar5;
  float fVar10;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [12];
  float fVar14;
  Vec4 local_78;
  Vec4 *local_60;
  long local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  Vector<float,_4> local_40;
  
  local_60 = dst;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_58 = CONCAT44(extraout_var,iVar4);
  pf = (PixelFormat *)(local_58 + 8);
  pGVar3 = this->m_colors;
  pGVar1 = pGVar3 + (index << 3);
  local_78.m_data._0_8_ = *(undefined8 *)pGVar1;
  local_78.m_data._8_8_ = *(undefined8 *)(pGVar1 + 2);
  MaskChannels(pf,&local_78);
  *(undefined8 *)src->m_data = local_50;
  *(undefined8 *)(src->m_data + 2) = uStack_48;
  pGVar3 = pGVar3 + (long)(index << 3) + 4;
  local_78.m_data._0_8_ = *(undefined8 *)pGVar3;
  local_78.m_data._8_8_ = *(undefined8 *)(pGVar3 + 2);
  MaskChannels(pf,&local_78);
  a = local_60;
  *(undefined8 *)local_60->m_data = local_50;
  *(undefined8 *)(local_60->m_data + 2) = uStack_48;
  tcu::Vector<float,_4>::Vector(&local_78,0.0);
  tcu::Vector<float,_4>::Vector(&local_40,1.0);
  tcu::clamp<float,4>((tcu *)&local_50,src,&local_78,&local_40);
  *(undefined8 *)src->m_data = local_50;
  *(undefined8 *)(src->m_data + 2) = uStack_48;
  tcu::Vector<float,_4>::Vector(&local_78,0.0);
  tcu::Vector<float,_4>::Vector(&local_40,1.0);
  tcu::clamp<float,4>((tcu *)&local_50,a,&local_78,&local_40);
  fVar14 = 1.0;
  *(undefined8 *)a->m_data = local_50;
  *(undefined8 *)(a->m_data + 2) = uStack_48;
  fVar2 = a->m_data[2];
  if (*(int *)(local_58 + 0x14) != 0) {
    fVar14 = (float)(1 << ((byte)*(int *)(local_58 + 0x14) & 0x1f)) + -1.0;
    fVar14 = (float)((long)(a->m_data[3] * fVar14) & 0xffffffff) / fVar14;
  }
  fVar12 = (float)(1 << ((byte)*(undefined4 *)(local_58 + 0x10) & 0x1f)) + -1.0;
  auVar11._0_4_ =
       (float)(int)(float)((int)*(undefined8 *)(local_58 + 8) * 0x800000 + 0x3f800000) + -1.0;
  auVar11._4_4_ =
       (float)(int)(float)((int)((ulong)*(undefined8 *)(local_58 + 8) >> 0x20) * 0x800000 +
                          0x3f800000) + -1.0;
  auVar11._8_8_ = 0;
  fVar5 = (float)*(undefined8 *)a->m_data * auVar11._0_4_;
  fVar10 = (float)((ulong)*(undefined8 *)a->m_data >> 0x20) * auVar11._4_4_;
  auVar7._0_4_ = (int)fVar5;
  auVar7._4_4_ = (int)fVar10;
  auVar7._8_4_ = 0;
  auVar13._0_4_ = auVar7._0_4_ >> 0x1f;
  auVar13._4_4_ = auVar7._4_4_ >> 0x1f;
  auVar13._8_4_ = 0;
  auVar6._0_4_ = (int)(fVar5 - 2.1474836e+09);
  auVar6._4_4_ = (int)(fVar10 - 2.1474836e+09);
  auVar6._8_4_ = 0x80000000;
  auVar7 = auVar6 & auVar13 | auVar7;
  auVar9._0_4_ = auVar7._0_4_;
  auVar9._4_4_ = 0;
  auVar9._8_4_ = auVar7._4_4_;
  auVar9._12_4_ = 0;
  auVar8._0_4_ = (float)(SUB168(auVar9 | _DAT_016ff520,0) - (double)DAT_016ff520);
  auVar8._4_4_ = (float)(SUB168(auVar9 | _DAT_016ff520,8) - DAT_016ff520._8_8_);
  auVar8._8_8_ = 0;
  auVar9 = divps(auVar8,auVar11);
  *(long *)a->m_data = auVar9._0_8_;
  a->m_data[2] = (float)((long)(fVar2 * fVar12) & 0xffffffff) / fVar12;
  a->m_data[3] = fVar14;
  return;
}

Assistant:

void BlendTestCaseGroup::BlendTest::getTestColors(int index, tcu::Vec4& src, tcu::Vec4& dst) const
{
	DE_ASSERT(0 <= index && index < m_numColors);

	const tcu::RenderTarget& rt = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf = rt.getPixelFormat();
	const glw::GLfloat*		 s  = m_colors + 8 * index;

	src = MaskChannels(pf, tcu::Vec4(s[0], s[1], s[2], s[3]));
	dst = MaskChannels(pf, tcu::Vec4(s[4], s[5], s[6], s[7]));
	src = tcu::clamp(src, tcu::Vec4(0.f), tcu::Vec4(1.f));
	dst = tcu::clamp(dst, tcu::Vec4(0.f), tcu::Vec4(1.f));

	// Quantize the destination channels
	// this matches what implementation does on render target write
	dst = QuantizeChannels(pf, dst);
}